

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qscopedpointer.h
# Opt level: O3

bool __thiscall QWizard::hasVisitedPage(QWizard *this,int theid)

{
  long lVar1;
  int *piVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  
  lVar3 = *(long *)&(this->super_QDialog).super_QWidget.field_0x8;
  lVar4 = *(long *)(lVar3 + 0x330);
  if (lVar4 != 0) {
    lVar5 = 0;
    while (lVar4 << 2 != lVar5) {
      lVar1 = lVar5 + 4;
      piVar2 = (int *)(*(long *)(lVar3 + 0x328) + lVar5);
      lVar5 = lVar1;
      if (*piVar2 == theid) {
        return lVar1 != 0;
      }
    }
  }
  return false;
}

Assistant:

T *get() const noexcept
    {
        return d;
    }